

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::execAddiRg<(moira::Instr)120,(moira::Mode)0,(moira::Size)2>(Moira *this,u16 opcode)

{
  ushort uVar1;
  ushort uVar2;
  u32 uVar3;
  bool bVar4;
  ulong uVar5;
  
  uVar1 = (this->queue).irc;
  readExt(this);
  uVar2 = *(ushort *)((long)this->exec + (ulong)(opcode & 7) * 4 + -0x58);
  uVar5 = (ulong)uVar2 - (ulong)uVar1;
  bVar4 = (bool)((byte)(uVar5 >> 0x10) & 1);
  (this->reg).sr.c = bVar4;
  (this->reg).sr.x = bVar4;
  (this->reg).sr.v = SUB41(((uint)(uVar1 ^ uVar2) & ((uint)uVar5 ^ (uint)uVar2)) >> 0xf,0);
  (this->reg).sr.z = (short)uVar5 == 0;
  (this->reg).sr.n = (bool)((byte)(uVar5 >> 0xf) & 1);
  uVar3 = (this->reg).pc;
  (this->reg).pc0 = uVar3;
  (this->queue).ird = (this->queue).irc;
  uVar3 = readM<(moira::MemSpace)2,(moira::Size)2,4ul>(this,uVar3 + 2);
  (this->queue).irc = (u16)uVar3;
  *(short *)((long)this->exec + (ulong)(opcode & 7) * 4 + -0x58) = (short)uVar5;
  return;
}

Assistant:

void
Moira::execAddiRg(u16 opcode)
{
    u32 src = readI<S>();
    int dst = _____________xxx(opcode);

    u32 ea, data, result;
    if (!readOp<M,S>(dst, ea, data)) return;

    result = addsub<I,S>(src, data);
    prefetch<POLLIPL>();

    if (S == Long) sync(4);
    writeD<S>(dst, result);
}